

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentPlanner.cpp
# Opt level: O2

vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> * __thiscall
multi_agent_planning::MultiAgentPlanner::solve_best_alternative
          (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           *__return_storage_ptr__,MultiAgentPlanner *this,
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          *agents,vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                  *instances,Scenario *scenario,int theta)

{
  pointer pPVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  Plan *this_00;
  int iVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  vector<int,_std::allocator<int>_> alternativeCosts;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> alternativePlans;
  vector<int,_std::allocator<int>_> costs;
  Plan plan;
  string local_70;
  Plan local_50;
  
  solve_baseline(__return_storage_ptr__,this,agents,instances);
  std::vector<int,_std::allocator<int>_>::vector
            (&costs,(long)(agents->
                          super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(agents->
                          super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&plan);
  lVar9 = 0;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(agents->
                            super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(agents->
                            super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 6); uVar8 = uVar8 + 1) {
    this_00 = &local_50;
    Plan::Plan(&local_50,
               (Plan *)((long)&(((__return_storage_ptr__->
                                 super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->actions).
                               super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                               ._M_impl + lVar9));
    iVar2 = evaluate_one_plan((MultiAgentPlanner *)this_00,__return_storage_ptr__,scenario,&local_50
                              ,(int)uVar8);
    costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar8] = iVar2;
    std::
    _Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
    ::~_Vector_base((_Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                     *)&local_50);
    lVar9 = lVar9 + 0x20;
  }
  bVar10 = false;
  for (iVar2 = 1; (!bVar10 && (iVar2 < theta)); iVar2 = iVar2 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"!!!!!!!!!!!! Iteration ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," !!!!!!!!!!!!");
    std::endl<char,std::char_traits<char>>(poVar3);
    alternativePlans.
    super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    alternativePlans.
    super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    alternativePlans.
    super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lVar9 = 0;
    lVar11 = 0;
    uVar8 = 0;
    while( true ) {
      pPVar1 = (agents->
               super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(agents->
                    super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 6;
      if (uVar4 <= uVar8) break;
      PlanningAgent::computeInterDependentPlan
                (&plan,(PlanningAgent *)((long)&pPVar1->agent_id + lVar11),
                 (Instance *)
                 ((long)&((instances->
                          super__Vector_base<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                          )._M_impl.super__Vector_impl_data._M_start)->start + lVar9),scenario,
                 __return_storage_ptr__,1.0);
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
      push_back(&alternativePlans,&plan);
      PlanningAgent::planToString_abi_cxx11_
                (&local_70,
                 (PlanningAgent *)
                 ((long)&((agents->
                          super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                          )._M_impl.super__Vector_impl_data._M_start)->agent_id + lVar11),&plan);
      std::operator<<((ostream *)&std::cout,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      local_70._M_dataplus._M_p._0_4_ = (int)plan.cost;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&alternativeCosts,(int *)&local_70);
      std::
      _Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
      ::~_Vector_base((_Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                       *)&plan);
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0x40;
      lVar9 = lVar9 + 0x10;
    }
    bVar10 = true;
    uVar8 = 0;
    iVar6 = 0;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      iVar7 = costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5] -
              alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      if (0 < iVar7) {
        bVar10 = false;
      }
      if (iVar6 < iVar7) {
        uVar8 = uVar5 & 0xffffffff;
        iVar6 = iVar7;
      }
    }
    iVar6 = (int)uVar8;
    if (!bVar10) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Agent ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
      poVar3 = std::operator<<(poVar3," wins!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    Plan::operator=((__return_storage_ptr__->
                    super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                    )._M_impl.super__Vector_impl_data._M_start + iVar6,
                    alternativePlans.
                    super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar6);
    costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar6] = alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar6];
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&alternativeCosts.super__Vector_base<int,_std::allocator<int>_>);
    std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
              (&alternativePlans);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&costs.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<Plan> MultiAgentPlanner::solve_best_alternative(std::vector<PlanningAgent>& agents, 
																											const std::vector<Instance>& instances, 
																											const Scenario& scenario,
																											const int theta) {
	
	vector<Plan> plans = solve_baseline(agents, instances);

	vector<int> costs(agents.size());
	for (int id = 0; id < agents.size(); ++id) {
		costs[id] = evaluate_one_plan(plans, scenario, plans[id], id);
	}

	int iteration_counter = 1;
	bool convergence = false;

	while ((! convergence) && (iteration_counter < theta)) {
		cout << "!!!!!!!!!!!! Iteration " << iteration_counter << " !!!!!!!!!!!!" << endl;

		vector<Plan> alternativePlans;
		vector<int> alternativeCosts;

		for (int i = 0; i < agents.size(); ++i) {
			Plan plan = agents[i].computeInterDependentPlan(instances[i], scenario, plans);

			alternativePlans.push_back(plan);

			cout << agents[i].planToString(plan);

			alternativeCosts.push_back(plan.cost);

			//int alt_plan_cost = evaluate_one_plan(plans, scenario, plan, i);
			
			//alternativeCosts.push_back(alt_plan_cost);

			//cout << "Inter-dependent plan cost: " << alt_plan_cost << endl;
		}

		int best_alt = 0;
		int best_diff = 0;
		convergence = true;
		
		for (int i = 0; i < agents.size(); ++i) {
			int cost_diff = costs[i] - alternativeCosts[i];

			if (cost_diff > 0) {
				convergence = false;
			}
			
			if (cost_diff > best_diff) {
				best_diff = cost_diff;
				best_alt = i;
			}
		}

		if (! convergence) {
			cout << "Agent " << best_alt << " wins!" << endl;
		}

		plans[best_alt] = alternativePlans[best_alt];
		costs[best_alt] = alternativeCosts[best_alt];

		iteration_counter++;

	}

	return plans;
}